

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::java::(anonymous_namespace)::TypeName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,FieldDescriptor *field,
          ClassNameResolver *name_resolver,bool boxed)

{
  JavaType JVar1;
  Descriptor *descriptor;
  string *psVar2;
  EnumDescriptor *descriptor_00;
  string *extraout_RAX;
  string_view sVar3;
  
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if (JVar1 == JAVATYPE_MESSAGE) {
    descriptor = FieldDescriptor::message_type((FieldDescriptor *)this);
    psVar2 = ClassNameResolver::GetClassName_abi_cxx11_
                       (__return_storage_ptr__,(ClassNameResolver *)field,descriptor,true);
    return psVar2;
  }
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if (JVar1 == JAVATYPE_ENUM) {
    descriptor_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    psVar2 = ClassNameResolver::GetClassName_abi_cxx11_
                       (__return_storage_ptr__,(ClassNameResolver *)field,descriptor_00,true);
    return psVar2;
  }
  JVar1 = GetJavaType((FieldDescriptor *)this);
  if ((char)name_resolver == '\0') {
    sVar3 = PrimitiveTypeName(JVar1);
  }
  else {
    sVar3 = BoxedPrimitiveTypeName(JVar1);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,sVar3._M_str,sVar3._M_str + sVar3._M_len);
  return extraout_RAX;
}

Assistant:

std::string TypeName(const FieldDescriptor* field,
                     ClassNameResolver* name_resolver, bool boxed) {
  if (GetJavaType(field) == JAVATYPE_MESSAGE) {
    return name_resolver->GetImmutableClassName(field->message_type());
  } else if (GetJavaType(field) == JAVATYPE_ENUM) {
    return name_resolver->GetImmutableClassName(field->enum_type());
  } else {
    return std::string(boxed ? BoxedPrimitiveTypeName(GetJavaType(field))
                             : PrimitiveTypeName(GetJavaType(field)));
  }
}